

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_iarchive.h
# Opt level: O3

size_type __thiscall serialization::json_iarchive::load_sequence_start(json_iarchive *this)

{
  _Elt_pointer ppGVar1;
  undefined8 *puVar2;
  
  ppGVar1 = (this->stack_).c.
            super__Deque_base<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*,_std::allocator<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppGVar1 !=
      (this->stack_).c.
      super__Deque_base<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*,_std::allocator<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    if (ppGVar1 ==
        (this->stack_).c.
        super__Deque_base<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*,_std::allocator<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      if (((this->stack_).c.
           super__Deque_base<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*,_std::allocator<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x3f]->data_).f.flags == 4) {
        ppGVar1 = (this->stack_).c.
                  super__Deque_base<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*,_std::allocator<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
        goto LAB_00112a0d;
      }
    }
    else if ((ppGVar1[-1]->data_).f.flags == 4) {
LAB_00112a0d:
      if ((ppGVar1[-1]->data_).f.flags != 4) {
        __assert_fail("IsArray()",
                      "/workspace/llm4binary/github/license_c_cmakelists/avplayer[P]serialization2/examples/../include/serialization/detail/rapidjson/document.h"
                      ,0x6c2,
                      "ConstArray rapidjson::GenericValue<rapidjson::UTF8<>>::GetArray() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                     );
      }
      return (ppGVar1[-1]->data_).s.length;
    }
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(0x18);
  *puVar2 = &PTR__exception_00120d50;
  puVar2[1] = "json";
  puVar2[2] = "expect array";
  __cxa_throw(puVar2,&serialization_error::typeinfo,std::exception::~exception);
}

Assistant:

size_type load_sequence_start() const
    {
        if(stack_.empty() || (!stack_.top()->IsArray()))
            throw_serialization_error("expect array", "json");
        return stack_.top()->GetArray().Size();
    }